

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeDefUse(DefUseManager *this,Module *module)

{
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  if (module != (Module *)0x0) {
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x18);
    *(code **)local_48._M_unused._0_8_ = AnalyzeInstDef;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
    *(DefUseManager **)((long)local_48._M_unused._0_8_ + 0x10) = this;
    pcStack_30 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_std::_Bind<void_(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>))(spvtools::opt::Instruction_*)>_>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_std::_Bind<void_(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>))(spvtools::opt::Instruction_*)>_>
               ::_M_manager;
    Module::ForEachInst(module,(function<void_(spvtools::opt::Instruction_*)> *)&local_48,true);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x18);
    *(code **)local_48._M_unused._0_8_ = AnalyzeInstUse;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
    *(DefUseManager **)((long)local_48._M_unused._0_8_ + 0x10) = this;
    pcStack_30 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_std::_Bind<void_(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>))(spvtools::opt::Instruction_*)>_>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_std::_Bind<void_(spvtools::opt::analysis::DefUseManager::*(spvtools::opt::analysis::DefUseManager_*,_std::_Placeholder<1>))(spvtools::opt::Instruction_*)>_>
               ::_M_manager;
    Module::ForEachInst(module,(function<void_(spvtools::opt::Instruction_*)> *)&local_48,true);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

void DefUseManager::AnalyzeDefUse(Module* module) {
  if (!module) return;
  // Analyze all the defs before any uses to catch forward references.
  module->ForEachInst(
      std::bind(&DefUseManager::AnalyzeInstDef, this, std::placeholders::_1),
      true);
  module->ForEachInst(
      std::bind(&DefUseManager::AnalyzeInstUse, this, std::placeholders::_1),
      true);
}